

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cc
# Opt level: O1

bool GetUniquePathFromEnv(char *env_name,char *path)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  byte *pbVar4;
  char *pcVar5;
  char *pcVar6;
  byte *pbVar7;
  char local_138 [8];
  char forceVarName [256];
  
  pbVar4 = (byte *)getenv(env_name);
  if ((pbVar4 == (byte *)0x0) || (*pbVar4 == 0)) {
    return false;
  }
  pcVar5 = getenv("PMIX_RANK");
  if ((pcVar5 == (char *)0x0) || (*pcVar5 == '\0')) {
    pcVar5 = getenv("SLURM_JOB_ID");
    if ((pcVar5 == (char *)0x0) || (*pcVar5 == '\0')) {
      pcVar5 = getenv("OMPI_HOME");
      if ((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) goto LAB_00107960;
      pcVar5 = getenv("PMI_RANK");
      if ((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) goto LAB_001078f8;
      bVar3 = false;
    }
    else {
      pcVar5 = getenv("SLURM_PROCID");
      if ((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) {
        pcVar6 = ".slurmid-";
        goto LAB_001078ff;
      }
LAB_00107960:
      bVar3 = true;
    }
    pcVar5 = "";
    forceVarName._248_8_ = (long)"Check failed: rv < 0: sigprocmask(~0, addr, ...)\n" + 0x31;
  }
  else {
LAB_001078f8:
    pcVar6 = ".rank-";
LAB_001078ff:
    bVar3 = false;
    forceVarName._248_8_ = pcVar6;
  }
  snprintf(local_138,0x100,"%s_USE_PID",env_name);
  bVar2 = 1;
  if (!bVar3) {
    pbVar7 = (byte *)getenv(local_138);
    if (pbVar7 != (byte *)0x0) {
      bVar1 = *pbVar7;
      if ((((bVar1 - 0x54 < 0x26) && ((0x2100000021U >> ((ulong)(bVar1 - 0x54) & 0x3f) & 1) != 0))
          || (bVar1 == 0)) || (bVar1 == 0x31)) goto LAB_001079f4;
    }
    bVar2 = 0;
  }
LAB_001079f4:
  bVar1 = *pbVar4;
  *pbVar4 = bVar1 & 0x7f;
  if ((bool)((char)bVar1 < '\0' | bVar2)) {
    getpid();
    pcVar6 = "%s%s%s_%d";
  }
  else {
    pcVar6 = "%s%s%s";
  }
  snprintf(path,0x1000,pcVar6,pbVar4,forceVarName._248_8_,pcVar5);
  if (!(bool)(-1 < (char)bVar1 & bVar2)) {
    *pbVar4 = *pbVar4 | 0x80;
  }
  return true;
}

Assistant:

bool GetUniquePathFromEnv(const char* env_name, char* path) {
  char* envval = getenv(env_name);

  if (envval == nullptr || *envval == '\0') {
    return false;
  }

  const char* append1 = "";
  const char* append2 = "";
  bool pidIsForced;
  std::tie(pidIsForced, append1, append2) = QueryHPCEnvironment();

  // Generate the "forcing" environment variable name in a form of
  // <ORIG_ENVAR>_USE_PID that requests PID to be used in the file names
  char forceVarName[256];
  snprintf(forceVarName, sizeof(forceVarName), "%s_USE_PID", env_name);

  pidIsForced = pidIsForced || EnvToBool(forceVarName, false);

  // Get information about the child bit and drop it
  const bool childBitDetected = (*envval & 128) != 0;
  *envval &= ~128;

  if (pidIsForced || childBitDetected) {
    snprintf(path, PATH_MAX, "%s%s%s_%d",
             envval, append1, append2, GetPID());
  } else {
    snprintf(path, PATH_MAX, "%s%s%s", envval, append1, append2);
  }

  // Set the child bit for the fork'd processes, unless appending pid
  // was forced by either _USE_PID thingy or via MPI detection stuff.
  if (childBitDetected || !pidIsForced) {
    *envval |= 128;
  }
  return true;
}